

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<MyTestType,false,std::allocator<unsigned_long>>::assign<unsigned_long*>
          (View<MyTestType,false,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,pointer data,CoordinateOrder *externalCoordinateOrder,
          CoordinateOrder *internalCoordinateOrder,allocator_type *allocator)

{
  allocator<unsigned_long> local_71;
  Geometry<std::allocator<unsigned_long>_> local_70;
  CoordinateOrder *local_38;
  CoordinateOrder *internalCoordinateOrder_local;
  CoordinateOrder *externalCoordinateOrder_local;
  pointer data_local;
  unsigned_long *end_local;
  unsigned_long *begin_local;
  View<MyTestType,_false,_std::allocator<unsigned_long>_> *this_local;
  
  local_38 = internalCoordinateOrder;
  internalCoordinateOrder_local = externalCoordinateOrder;
  externalCoordinateOrder_local = (CoordinateOrder *)data;
  data_local = (pointer)end;
  end_local = begin;
  begin_local = (unsigned_long *)this;
  std::allocator<unsigned_long>::allocator<MyTestType>(&local_71,allocator);
  marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)&local_70,begin,end,externalCoordinateOrder,
             internalCoordinateOrder,&local_71);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_70);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_70);
  std::allocator<unsigned_long>::~allocator(&local_71);
  *(CoordinateOrder **)this = externalCoordinateOrder_local;
  View<MyTestType,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::assign
(
    ShapeIterator begin,
    ShapeIterator end,
    pointer data,
    const CoordinateOrder& externalCoordinateOrder,
    const CoordinateOrder& internalCoordinateOrder,
    const allocator_type& allocator
)
{
    // the invariant is not tested as a pre-condition of this
    // function to allow for unsafe manipulations prior to its
    // call
    geometry_ = typename marray_detail::Geometry<A>(begin, end, 
        externalCoordinateOrder, internalCoordinateOrder, allocator);
    data_ = data;
    testInvariant();    
}